

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

size_t __thiscall SoftHSM::RFC5652Pad(SoftHSM *this,ByteString *keydata,size_t blocksize)

{
  size_t sVar1;
  uchar *__s;
  ByteString *in_RDX;
  size_t padbytes;
  size_t wrappedlen;
  size_t in_stack_ffffffffffffffc8;
  undefined8 local_28;
  
  sVar1 = ByteString::size((ByteString *)0x186edd);
  local_28 = (ByteString *)((long)in_RDX - sVar1 % (ulong)in_RDX);
  if (local_28 == (ByteString *)0x0) {
    local_28 = in_RDX;
  }
  ByteString::resize(in_RDX,in_stack_ffffffffffffffc8);
  __s = ByteString::operator[](in_RDX,in_stack_ffffffffffffffc8);
  memset(__s,(uint)(byte)local_28,(size_t)local_28);
  sVar1 = ByteString::size((ByteString *)0x186f63);
  return sVar1;
}

Assistant:

size_t SoftHSM::RFC5652Pad(ByteString &keydata, size_t blocksize)
{
	size_t wrappedlen = keydata.size();
	auto padbytes = blocksize - (wrappedlen % blocksize);
	if(padbytes == 0)
		padbytes += blocksize;

	keydata.resize(wrappedlen + padbytes);
	memset(&keydata[wrappedlen], static_cast<char>(padbytes), padbytes);
	return keydata.size();
}